

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O3

void TranslateModuleTypeInformation(ExpressionTranslateContext *ctx)

{
  TypeBase *pTVar1;
  long lVar2;
  long lVar3;
  ExpressionContext *pEVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  long *plVar10;
  char *pcVar11;
  TypeStruct *typeStruct;
  ulong uVar12;
  bool bVar13;
  
  PrintIndentedLine(ctx,"// Register types");
  pEVar4 = ctx->ctx;
  if ((pEVar4->types).count != 0) {
    uVar12 = 0;
    do {
      pTVar1 = (pEVar4->types).data[uVar12];
      if (pTVar1->isGeneric == true) {
        PrintIndentedLine(ctx,"__nullcTR[%d] = 0; // generic type \'%.*s\'",uVar12 & 0xffffffff,
                          (ulong)(uint)(*(int *)&(pTVar1->name).end - (int)(pTVar1->name).begin));
        goto LAB_0014647b;
      }
      PrintIndent(ctx);
      Print(ctx,"__nullcTR[%d] = __nullcRegisterType(",uVar12 & 0xffffffff);
      Print(ctx,"%uu, ",(ulong)pTVar1->nameHash);
      Print(ctx,"\"%.*s\", ",(ulong)(uint)(*(int *)&(pTVar1->name).end - (int)(pTVar1->name).begin))
      ;
      Print(ctx,"%lld, ",pTVar1->size);
      switch(pTVar1->typeID) {
      case 0x10:
      case 0x11:
      case 0x19:
        lVar2._0_4_ = pTVar1[1].typeID;
        lVar2._4_4_ = pTVar1[1].nameHash;
        uVar8 = 0;
        for (; lVar2 != 0; lVar2 = *(long *)(lVar2 + 0x18)) {
          uVar8 = uVar8 + (**(char **)(*(long *)(*(long *)(lVar2 + 8) + 0x28) + 0x40) != '$');
        }
        Print(ctx,"__nullcTR[0], ");
        Print(ctx,"%d, NULLC_CLASS, %d, 0);",(ulong)uVar8,(ulong)pTVar1->alignment);
        goto LAB_00146466;
      case 0x12:
        Print(ctx,"__nullcTR[%d], ",(ulong)*(uint *)(pTVar1[1]._vptr_TypeBase + 5));
        uVar7 = (ulong)pTVar1->alignment;
        pcVar11 = "1, NULLC_POINTER, %d, 0);";
        break;
      case 0x13:
        Print(ctx,"__nullcTR[%d], ",(ulong)*(uint *)(pTVar1[1]._vptr_TypeBase + 5));
        Print(ctx,"%d, NULLC_ARRAY, %d, 0);",(ulong)pTVar1[1].typeID,(ulong)pTVar1->alignment);
        goto LAB_00146466;
      case 0x14:
        Print(ctx,"__nullcTR[%d], ",(ulong)*(uint *)(*(long *)&pTVar1[1].typeIndex + 0x28));
        uVar7 = (ulong)pTVar1->alignment;
        pcVar11 = "-1, NULLC_ARRAY, %d, 0);";
        break;
      case 0x15:
        Print(ctx,"__nullcTR[%d], ",(ulong)*(uint *)(pTVar1[1]._vptr_TypeBase + 5));
        uVar7 = (ulong)pTVar1->alignment;
        pcVar11 = "0, NULLC_FUNCTION, %d, 0);";
        break;
      default:
        Print(ctx,"__nullcTR[0], ");
        uVar7 = (ulong)pTVar1->alignment;
        pcVar11 = "0, NULLC_NONE, %d, 0);";
        break;
      case 0x18:
        lVar3._0_4_ = pTVar1[1].typeID;
        lVar3._4_4_ = pTVar1[1].nameHash;
        uVar7 = 0;
        uVar8 = 0;
        if (lVar3 != 0) {
          uVar8 = 0;
          do {
            plVar10 = (long *)(lVar3 + 8);
            lVar3 = *(long *)(lVar3 + 0x18);
            uVar8 = uVar8 + (**(char **)(*(long *)(*plVar10 + 0x28) + 0x40) != '$');
          } while (lVar3 != 0);
        }
        if (pTVar1[2].unsizedArrayType != (TypeUnsizedArray *)0x0) {
          uVar7 = (ulong)((pTVar1[2].unsizedArrayType)->super_TypeStruct).super_TypeBase.typeIndex;
        }
        Print(ctx,"__nullcTR[%d], ",uVar7);
        Print(ctx,"%d, NULLC_CLASS, %d, ",(ulong)uVar8,(ulong)pTVar1->alignment);
        bVar13 = *(char *)((long)&pTVar1[3]._vptr_TypeBase + 2) == '\x01';
        if (bVar13) {
          Print(ctx,"NULLC_TYPE_FLAG_HAS_FINALIZER");
        }
        if (*(char *)&pTVar1[2].arrayTypes.tail == '\x01') {
          pcVar11 = "";
          if (bVar13) {
            pcVar11 = " | ";
          }
          Print(ctx,"%sNULLC_TYPE_FLAG_IS_EXTENDABLE",pcVar11);
          bVar13 = true;
        }
        if (*(char *)&pTVar1[3]._vptr_TypeBase == '\0') {
          pcVar11 = "";
          if (bVar13) {
            pcVar11 = " | ";
          }
          Print(ctx,"%sNULLC_TYPE_FLAG_FORWARD_DECLARATION",pcVar11);
        }
        else if (!bVar13) {
          Print(ctx,"0");
        }
        Print(ctx,");");
        goto LAB_00146466;
      }
      Print(ctx,pcVar11,uVar7);
LAB_00146466:
      OutputContext::Print(ctx->output,"\n",1);
LAB_0014647b:
      uVar12 = uVar12 + 1;
      pEVar4 = ctx->ctx;
    } while (uVar12 < (pEVar4->types).count);
  }
  OutputContext::Print(ctx->output,"\n",1);
  PrintIndentedLine(ctx,"// Register type members");
  pEVar4 = ctx->ctx;
  if ((pEVar4->types).count != 0) {
    uVar12 = 0;
    do {
      pTVar1 = (pEVar4->types).data[uVar12];
      if ((pTVar1->isGeneric == false) && (uVar8 = pTVar1->typeID, uVar8 < 0x1a)) {
        if ((0x3130000U >> (uVar8 & 0x1f) & 1) == 0) {
          if (uVar8 != 0x15) goto LAB_00146639;
          PrintIndent(ctx);
          lVar6._0_4_ = pTVar1[1].typeID;
          lVar6._4_4_ = pTVar1[1].nameHash;
          uVar7 = 0;
          for (; lVar6 != 0; lVar6 = *(long *)(lVar6 + 8)) {
            uVar7 = (ulong)((int)uVar7 + 1);
          }
          Print(ctx,"__nullcRegisterMembers(__nullcTR[%d], %d",uVar12 & 0xffffffff,uVar7);
          plVar10 = *(long **)&pTVar1[1].typeID;
          pcVar11 = "); // type \'%.*s\' arguments";
          if (plVar10 != (long *)0x0) {
            do {
              Print(ctx,", __nullcTR[%d]",(ulong)*(uint *)(*plVar10 + 0x28));
              Print(ctx,", 0");
              Print(ctx,", \"\"");
              plVar10 = (long *)plVar10[1];
            } while (plVar10 != (long *)0x0);
            pcVar11 = "); // type \'%.*s\' arguments";
          }
        }
        else {
          lVar5._0_4_ = pTVar1[1].typeID;
          lVar5._4_4_ = pTVar1[1].nameHash;
          uVar8 = 0;
          for (; lVar5 != 0; lVar5 = *(long *)(lVar5 + 0x18)) {
            uVar8 = uVar8 + (**(char **)(*(long *)(*(long *)(lVar5 + 8) + 0x28) + 0x40) != '$');
          }
          PrintIndent(ctx);
          Print(ctx,"__nullcRegisterMembers(__nullcTR[%d], %d",uVar12 & 0xffffffff,(ulong)uVar8);
          lVar9._0_4_ = pTVar1[1].typeID;
          lVar9._4_4_ = pTVar1[1].nameHash;
          pcVar11 = "); // type \'%.*s\' members";
          if (lVar9 != 0) {
            do {
              if (**(char **)(*(long *)(*(long *)(lVar9 + 8) + 0x28) + 0x40) != '$') {
                Print(ctx,", __nullcTR[%d]",
                      (ulong)*(uint *)(*(long *)(*(long *)(lVar9 + 8) + 0x20) + 0x28));
                Print(ctx,", %d",(ulong)*(uint *)(*(long *)(lVar9 + 8) + 0x3c));
                lVar3 = *(long *)(*(long *)(lVar9 + 8) + 0x28);
                Print(ctx,", \"%.*s\"",
                      (ulong)(uint)(*(int *)(lVar3 + 0x48) - (int)*(undefined8 *)(lVar3 + 0x40)));
              }
              lVar9 = *(long *)(lVar9 + 0x18);
            } while (lVar9 != 0);
            pcVar11 = "); // type \'%.*s\' members";
          }
        }
        Print(ctx,pcVar11,(ulong)(uint)(*(int *)&(pTVar1->name).end - (int)(pTVar1->name).begin));
        OutputContext::Print(ctx->output,"\n",1);
      }
LAB_00146639:
      uVar12 = uVar12 + 1;
      pEVar4 = ctx->ctx;
    } while (uVar12 < (pEVar4->types).count);
  }
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void TranslateModuleTypeInformation(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Register types");

	for(unsigned i = 0; i < ctx.ctx.types.size(); i++)
	{
		TypeBase *type = ctx.ctx.types[i];

		if(type->isGeneric)
		{
			PrintIndentedLine(ctx, "__nullcTR[%d] = 0; // generic type '%.*s'", i, FMT_ISTR(type->name));
			continue;
		}

		PrintIndent(ctx);
		Print(ctx, "__nullcTR[%d] = __nullcRegisterType(", i);
		Print(ctx, "%uu, ", type->nameHash);
		Print(ctx, "\"%.*s\", ", FMT_ISTR(type->name));
		Print(ctx, "%lld, ", type->size);

		if(TypeArray *typeArray = getType<TypeArray>(type))
		{
			Print(ctx, "__nullcTR[%d], ", typeArray->subType->typeIndex);
			Print(ctx, "%d, NULLC_ARRAY, %d, 0);", (unsigned)typeArray->length, typeArray->alignment);
		}
		else if(TypeUnsizedArray *typeUnsizedArray = getType<TypeUnsizedArray>(type))
		{
			Print(ctx, "__nullcTR[%d], ", typeUnsizedArray->subType->typeIndex);
			Print(ctx, "-1, NULLC_ARRAY, %d, 0);", typeUnsizedArray->alignment);
		}
		else if(TypeRef *typeRef = getType<TypeRef>(type))
		{
			Print(ctx, "__nullcTR[%d], ", typeRef->subType->typeIndex);
			Print(ctx, "1, NULLC_POINTER, %d, 0);", typeRef->alignment);
		}
		else if(TypeFunction *typeFunction = getType<TypeFunction>(type))
		{
			Print(ctx, "__nullcTR[%d], ", typeFunction->returnType->typeIndex);
			Print(ctx, "0, NULLC_FUNCTION, %d, 0);", typeFunction->alignment);
		}
		else if(TypeClass *typeClass = getType<TypeClass>(type))
		{
			unsigned count = 0;

			for(MemberHandle *curr = typeClass->members.head; curr; curr = curr->next)
			{
				if(*curr->variable->name->name.begin == '$')
					continue;

				count++;
			}

			Print(ctx, "__nullcTR[%d], ", typeClass->baseClass ? typeClass->baseClass->typeIndex : 0);
			Print(ctx, "%d, NULLC_CLASS, %d, ", count, typeClass->alignment);

			bool hasFlags = false;

			if(typeClass->hasFinalizer)
			{
				Print(ctx, "NULLC_TYPE_FLAG_HAS_FINALIZER");
				hasFlags = true;
			}

			if(typeClass->extendable)
			{
				Print(ctx, "%sNULLC_TYPE_FLAG_IS_EXTENDABLE", hasFlags ? " | " : "");
				hasFlags = true;
			}

			if(!typeClass->completed)
			{
				Print(ctx, "%sNULLC_TYPE_FLAG_FORWARD_DECLARATION", hasFlags ? " | " : "");
				hasFlags = true;
			}

			if(!hasFlags)
				Print(ctx, "0");

			Print(ctx, ");");
		}
		else if(TypeStruct *typeStruct = getType<TypeStruct>(type))
		{
			unsigned count = 0;

			for(MemberHandle *curr = typeStruct->members.head; curr; curr = curr->next)
			{
				if(*curr->variable->name->name.begin == '$')
					continue;

				count++;
			}

			Print(ctx, "__nullcTR[0], ");
			Print(ctx, "%d, NULLC_CLASS, %d, 0);", count, typeStruct->alignment);
		}
		else
		{
			Print(ctx, "__nullcTR[0], ");
			Print(ctx, "0, NULLC_NONE, %d, 0);", type->alignment);
		}

		PrintLine(ctx);
	}

	PrintLine(ctx);

	PrintIndentedLine(ctx, "// Register type members");

	for(unsigned i = 0; i < ctx.ctx.types.size(); i++)
	{
		TypeBase *type = ctx.ctx.types[i];

		if(type->isGeneric)
			continue;

		if(TypeFunction *typeFunction = getType<TypeFunction>(type))
		{
			PrintIndent(ctx);
			Print(ctx, "__nullcRegisterMembers(__nullcTR[%d], %d", i, typeFunction->arguments.size());

			for(TypeHandle *curr = typeFunction->arguments.head; curr; curr = curr->next)
			{
				Print(ctx, ", __nullcTR[%d]", curr->type->typeIndex);
				Print(ctx, ", 0");
				Print(ctx, ", \"\"");
			}

			Print(ctx, "); // type '%.*s' arguments", FMT_ISTR(type->name));
			PrintLine(ctx);
		}
		else if(TypeStruct *typeStruct = getType<TypeStruct>(type))
		{
			unsigned count = 0;

			for(MemberHandle *curr = typeStruct->members.head; curr; curr = curr->next)
			{
				if(*curr->variable->name->name.begin == '$')
					continue;

				count++;
			}

			PrintIndent(ctx);
			Print(ctx, "__nullcRegisterMembers(__nullcTR[%d], %d", i, count);

			for(MemberHandle *curr = typeStruct->members.head; curr; curr = curr->next)
			{
				if(*curr->variable->name->name.begin == '$')
					continue;

				Print(ctx, ", __nullcTR[%d]", curr->variable->type->typeIndex);
				Print(ctx, ", %d", curr->variable->offset);
				Print(ctx, ", \"%.*s\"", FMT_ISTR(curr->variable->name->name));
			}

			Print(ctx, "); // type '%.*s' members", FMT_ISTR(type->name));
			PrintLine(ctx);
		}
	}

	PrintLine(ctx);
}